

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O3

MPP_RET mpp_service_set_info(void *ctx,MppDevInfoCfg *cfg)

{
  undefined8 *puVar1;
  int iVar2;
  RK_U64 RVar3;
  MppDevMppService *p;
  
  if (*(int *)((long)ctx + 0x188) != 0) {
    iVar2 = *(int *)((long)ctx + 0x78);
    if ((long)iVar2 == 0) {
      memset((void *)((long)ctx + 0x80),0,0x100);
    }
    RVar3 = cfg->data;
    puVar1 = (undefined8 *)((long)ctx + (long)iVar2 * 0x10 + 0x80);
    *puVar1 = *(undefined8 *)cfg;
    puVar1[1] = RVar3;
    *(int *)((long)ctx + 0x78) = *(int *)((long)ctx + 0x78) + 1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_service_set_info(void *ctx, MppDevInfoCfg *cfg)
{
    MppDevMppService *p = (MppDevMppService *)ctx;

    if (!p->support_set_info)
        return MPP_OK;

    if (!p->info_count)
        memset(p->info, 0, sizeof(p->info));

    memcpy(&p->info[p->info_count], cfg, sizeof(MppDevInfoCfg));
    p->info_count++;

    return MPP_OK;
}